

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_json(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this,size_t id)

{
  pfn_error p_Var1;
  Location LVar2;
  bool bVar3;
  error_flags eVar4;
  NodeData *pNVar5;
  Callbacks *pCVar6;
  Tree *this_00;
  size_t sVar7;
  NodeScalar *in_RSI;
  Tree *in_RDI;
  size_t ich;
  char msg [37];
  undefined7 in_stack_fffffffffffffd88;
  char in_stack_fffffffffffffd8f;
  Tree *in_stack_fffffffffffffd90;
  size_t in_stack_fffffffffffffd98;
  size_t in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  Location *in_stack_fffffffffffffdb0;
  NodeScalar *in_stack_fffffffffffffdd8;
  Tree *in_stack_fffffffffffffde0;
  Tree *in_stack_fffffffffffffde8;
  size_t local_1e8;
  undefined8 local_1e0;
  Tree *pTStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  size_t local_1c0;
  char local_1b8 [40];
  size_t in_stack_fffffffffffffe70;
  NodeScalar *in_stack_fffffffffffffea0;
  NodeScalar *sc;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea8;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  NodeType in_stack_fffffffffffffeb0;
  NodeType flags;
  NodeType_e local_a0 [3];
  NodeType_e local_88;
  NodeType_e *local_80;
  NodeType_e local_78 [3];
  NodeType_e local_60;
  NodeType_e *local_58;
  NodeType_e local_50 [3];
  NodeType_e local_38;
  NodeType_e *local_30;
  NodeType_e local_28 [3];
  NodeType_e local_10;
  NodeType_e *local_8;
  
  pNVar5 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
  if (((pNVar5->m_type).type & STREAM) == STREAM) {
    memcpy(local_1b8,"check failed: !m_tree->is_stream(id)",0x25);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pCVar6 = Tree::callbacks((Tree *)in_RDI->m_size);
    p_Var1 = pCVar6->m_error;
    Location::Location(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0
                       ,in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90);
    pCVar6 = Tree::callbacks((Tree *)in_RDI->m_size);
    in_stack_fffffffffffffd88 = (undefined7)local_1e0;
    in_stack_fffffffffffffd8f = (char)((ulong)local_1e0 >> 0x38);
    LVar2.super_LineCol.line = (size_t)pTStack_1d8;
    LVar2.super_LineCol.offset = local_1e0;
    LVar2.super_LineCol.col = local_1d0;
    LVar2.name.str = (char *)uStack_1c8;
    LVar2.name.len = local_1c0;
    (*p_Var1)(local_1b8,0x25,LVar2,pCVar6->m_user_data);
    in_stack_fffffffffffffd90 = pTStack_1d8;
  }
  pNVar5 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
  if (((pNVar5->m_type).type & KEYVAL) == KEYVAL) {
    this_00 = (Tree *)Tree::keysc(in_stack_fffffffffffffde8,(size_t)in_RDI);
    pNVar5 = Tree::_p(in_RDI,(size_t)in_stack_fffffffffffffdd8);
    local_60 = (pNVar5->m_type).type & ~VAL;
    local_58 = local_78;
    local_78[0] = local_60;
    _write_json(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffeb0);
    WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
              ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffd90,
               (char (*) [3])CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    Tree::valsc(this_00,(size_t)in_RDI);
    pNVar5 = Tree::_p(in_RDI,(size_t)in_stack_fffffffffffffdd8);
    local_10 = (pNVar5->m_type).type & ~KEY;
    local_8 = local_28;
    local_28[0] = local_10;
    _write_json(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffde0 = in_RDI;
  }
  else {
    pNVar5 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
    if (((pNVar5->m_type).type & KEYVAL) == VAL) {
      in_stack_fffffffffffffdd8 =
           Tree::valsc(in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
      pNVar5 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
      local_38 = (pNVar5->m_type).type & ~KEY;
      local_30 = local_50;
      local_50[0] = local_38;
      _write_json(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffeb0);
    }
    else {
      this_01 = (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDI->m_size;
      sc = in_RSI;
      pNVar5 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
      if (((pNVar5->m_type).type & (STREAM|MAP)) != NOTYPE) {
        flags.type = (NodeType_e)in_RSI;
        pNVar5 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
        if (((pNVar5->m_type).type & KEY) != NOTYPE) {
          Tree::keysc(in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
          pNVar5 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
          local_88 = (pNVar5->m_type).type & ~VAL;
          local_80 = local_a0;
          local_a0[0] = local_88;
          _write_json(this_01,sc,flags);
          WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                    ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffd90,
                     (char (*) [3])CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
        }
        pNVar5 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
        if (((pNVar5->m_type).type & SEQ) == NOTYPE) {
          pNVar5 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
          if (((pNVar5->m_type).type & MAP) != NOTYPE) {
            WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
          }
        }
        else {
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
        }
      }
    }
  }
  local_1e8 = Tree::first_child(in_stack_fffffffffffffd90,
                                CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  while (local_1e8 != 0xffffffffffffffff) {
    sVar7 = Tree::first_child(in_stack_fffffffffffffd90,
                              CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    if (local_1e8 != sVar7) {
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
    }
    _do_visit_json((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RSI,in_stack_fffffffffffffe70);
    local_1e8 = Tree::next_sibling(in_stack_fffffffffffffd90,
                                   CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  }
  pNVar5 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
  if (((pNVar5->m_type).type & SEQ) == NOTYPE) {
    pNVar5 = Tree::_p(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
    if (((pNVar5->m_type).type & MAP) != NOTYPE) {
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
    }
  }
  else {
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f);
  }
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_json(size_t id)
{
    _RYML_CB_CHECK(m_tree->callbacks(), !m_tree->is_stream(id)); // JSON does not have streams
    if(m_tree->is_keyval(id))
    {
        _writek_json(id);
        this->Writer::_do_write(": ");
        _writev_json(id);
    }
    else if(m_tree->is_val(id))
    {
        _writev_json(id);
    }
    else if(m_tree->is_container(id))
    {
        if(m_tree->has_key(id))
        {
            _writek_json(id);
            this->Writer::_do_write(": ");
        }
        if(m_tree->is_seq(id))
            this->Writer::_do_write('[');
        else if(m_tree->is_map(id))
            this->Writer::_do_write('{');
    }  // container

    for(size_t ich = m_tree->first_child(id); ich != NONE; ich = m_tree->next_sibling(ich))
    {
        if(ich != m_tree->first_child(id))
            this->Writer::_do_write(',');
        _do_visit_json(ich);
    }

    if(m_tree->is_seq(id))
        this->Writer::_do_write(']');
    else if(m_tree->is_map(id))
        this->Writer::_do_write('}');
}